

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O1

DdNode * Cudd_zddDivide(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddZddDivide(dd,f,g);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode  *
Cudd_zddDivide(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode      *res;

    do {
        dd->reordered = 0;
        res = cuddZddDivide(dd, f, g);
    } while (dd->reordered == 1);
    return(res);

}